

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

int __thiscall
icu_63::GregorianCalendar::clone
          (GregorianCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  GregorianCalendar *this_00;
  
  this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 != (GregorianCalendar *)0x0) {
    GregorianCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* GregorianCalendar::clone() const
{
    return new GregorianCalendar(*this);
}